

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O2

bool __thiscall Movie::Verify(Movie *this,Verifier *verifier)

{
  bool bVar1;
  Character type;
  void *obj;
  Vector<unsigned_char,_unsigned_int> *pVVar2;
  Vector<flatbuffers::Offset<void>,_unsigned_int> *pVVar3;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if (((bVar1) &&
      (bVar1 = flatbuffers::Table::VerifyField<unsigned_char>(&this->super_Table,verifier,4,1),
      bVar1)) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6), bVar1))
  {
    obj = main_character(this);
    type = main_character_type(this);
    bVar1 = VerifyCharacter(verifier,obj,type);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8), bVar1
       )) {
      pVVar2 = characters_type(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_int>
                        (verifier,pVVar2);
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10),
         bVar1)) {
        pVVar3 = characters(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::
                VerifyVector<flatbuffers::Offset<void>,_unsigned_int>(verifier,pVVar3);
        if (bVar1) {
          pVVar3 = characters(this);
          pVVar2 = characters_type(this);
          bVar1 = VerifyCharacterVector(verifier,pVVar3,pVVar2);
          if (bVar1) {
            verifier->depth_ = verifier->depth_ - 1;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<uint8_t>(verifier, VT_MAIN_CHARACTER_TYPE, 1) &&
           VerifyOffset(verifier, VT_MAIN_CHARACTER) &&
           VerifyCharacter(verifier, main_character(), main_character_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS_TYPE) &&
           verifier.VerifyVector(characters_type()) &&
           VerifyOffset(verifier, VT_CHARACTERS) &&
           verifier.VerifyVector(characters()) &&
           VerifyCharacterVector(verifier, characters(), characters_type()) &&
           verifier.EndTable();
  }